

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_atomic.cpp
# Opt level: O0

bool boost::thread_detail::enter_once_region(once_flag *flag)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  once_flag *in_RDI;
  atomic_int_type expected;
  pthread_mutex_scoped_lock lk;
  atomic_type *f;
  pthread_mutex_t *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  type local_c4 [5];
  atomic_type *local_b0;
  byte local_9d;
  undefined4 local_9c;
  atomic_type *local_98;
  undefined4 local_8c;
  atomic_type *local_88;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  type *local_70;
  atomic_type *local_68;
  type local_60;
  undefined4 local_5c;
  atomic_type *local_58;
  type local_50;
  undefined4 local_4c;
  atomic_type *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  bool local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  type *local_18;
  atomic_type *local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_b0 = get_atomic_storage(in_RDI);
  local_8c = 2;
  local_5c = 2;
  local_38 = 2;
  local_60 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
  if (local_60 != 2) {
    local_88 = local_b0;
    local_58 = local_b0;
    pthread::pthread_mutex_scoped_lock::pthread_mutex_scoped_lock
              ((pthread_mutex_scoped_lock *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
    local_98 = local_b0;
    local_9c = 2;
    local_48 = local_b0;
    local_4c = 2;
    local_3c = 2;
    local_50 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
    if (local_50 == 2) {
      bVar1 = false;
    }
    else {
      while( true ) {
        local_c4[0] = 0;
        local_68 = local_b0;
        local_70 = local_c4;
        local_74 = 1;
        local_78 = 6;
        local_7c = 2;
        local_30 = 6;
        local_34 = 2;
        local_10 = local_b0;
        local_1c = 1;
        local_20 = 6;
        local_24 = 2;
        local_4 = 6;
        local_28 = 1;
        local_8 = 2;
        switch(0x2b2ec4) {
        default:
          LOCK();
          tVar2 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
          local_29 = tVar2 == 0;
          if (local_29) {
            (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value = 1;
            tVar2 = 0;
          }
          UNLOCK();
          if (!local_29) {
            local_c4[0] = tVar2;
          }
          break;
        case 2:
          LOCK();
          tVar2 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
          local_29 = tVar2 == 0;
          if (local_29) {
            (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value = 1;
            tVar2 = 0;
          }
          UNLOCK();
          if (!local_29) {
            local_c4[0] = tVar2;
          }
          break;
        case 3:
          LOCK();
          tVar2 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
          local_29 = tVar2 == 0;
          if (local_29) {
            (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value = 1;
            tVar2 = 0;
          }
          UNLOCK();
          if (!local_29) {
            local_c4[0] = tVar2;
          }
          break;
        case 4:
          LOCK();
          tVar2 = (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value;
          local_29 = tVar2 == 0;
          if (local_29) {
            (local_b0->super_base_atomic<unsigned_int,_int>).m_storage.value = 1;
            tVar2 = 0;
          }
          UNLOCK();
          if (!local_29) {
            local_c4[0] = tVar2;
          }
        }
        local_18 = local_70;
        if (local_29 != false) break;
        if (local_c4[0] == 2) {
          local_9d = 0;
          bVar1 = true;
          goto LAB_002b3453;
        }
        iVar3 = pthread_cond_wait((pthread_cond_t *)once_cv,(pthread_mutex_t *)once_mutex);
        if (iVar3 != 0) {
          __assert_fail("!pthread_cond_wait(&once_cv, &once_mutex)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/libs/thread/src/pthread/once_atomic.cpp"
                        ,0x3c,"bool boost::thread_detail::enter_once_region(once_flag &)");
        }
        in_stack_fffffffffffffe20 = 0;
      }
      local_9d = 1;
      bVar1 = true;
    }
LAB_002b3453:
    pthread::pthread_mutex_scoped_lock::~pthread_mutex_scoped_lock
              ((pthread_mutex_scoped_lock *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (bVar1) goto LAB_002b3479;
  }
  local_9d = 0;
LAB_002b3479:
  return (bool)(local_9d & 1);
}

Assistant:

BOOST_THREAD_DECL bool enter_once_region(once_flag& flag) BOOST_NOEXCEPT
    {
      atomic_type& f = get_atomic_storage(flag);
      if (f.load(memory_order_acquire) != initialized)
      {
        pthread::pthread_mutex_scoped_lock lk(&once_mutex);
        if (f.load(memory_order_acquire) != initialized)
        {
          for (;;)
          {
            atomic_int_type expected = uninitialized;
            if (f.compare_exchange_strong(expected, in_progress, memory_order_acq_rel, memory_order_acquire))
            {
              // We have set the flag to in_progress
              return true;
            }
            else if (expected == initialized)
            {
              // Another thread managed to complete the initialization
              return false;
            }
            else
            {
              // Wait until the initialization is complete
              //pthread::pthread_mutex_scoped_lock lk(&once_mutex);
              BOOST_VERIFY(!pthread_cond_wait(&once_cv, &once_mutex));
            }
          }
        }
      }
      return false;
    }